

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

void program(void)

{
  bool bVar1;
  int local_c;
  int varSize;
  
  local_c = 0;
  getSymbol();
  if (currentSymbol == -2) {
    mark("no declaration found");
    exit(-1);
  }
  while (currentSymbol == 0x271) {
    getSymbol();
    includeStatement();
  }
  while( true ) {
    bVar1 = true;
    if ((currentSymbol != 0x267) && (bVar1 = true, currentSymbol != 0x266)) {
      bVar1 = currentSymbol == 0x26c;
    }
    if (!bVar1) break;
    if (currentSymbol == 0x26c) {
      getSymbol();
      functionPrototype();
    }
    else {
      local_c = declaration(local_c);
    }
  }
  emitHeader(local_c);
  if (currentSymbol != 0x265) {
    mark("at least one function required");
    exit(-1);
  }
  getSymbol();
  functionDeclaration();
  while( true ) {
    if (currentSymbol == -2) {
      return;
    }
    if (currentSymbol != 0x265) break;
    getSymbol();
    functionDeclaration();
  }
  mark("only function declarations allowed here");
  exit(-1);
}

Assistant:

procedure
void program(void) {
	variable int varSize;
	varSize = 0;
    getSymbol();
    if (currentSymbol == SYMBOL_END) {
        mark("no declaration found");
        exit(-1);
    }

   while (currentSymbol == SYMBOL_HASHINCLUDE) {
		getSymbol();
		includeStatement();
	}

   while ((currentSymbol == SYMBOL_VAR) || (currentSymbol == SYMBOL_RECORD) || (currentSymbol == SYMBOL_PROT)) {
		if (currentSymbol == SYMBOL_PROT) {
			getSymbol();
			functionPrototype();
		} else {
			varSize = declaration(varSize);
		}
	}
	/* emit program header (for stack pointer initialization) */
	emitHeader(varSize);
	
	if (currentSymbol == SYMBOL_PROC) {
		getSymbol();
		functionDeclaration();
	} else {
		mark("at least one function required");
		exit(-1);
	}
	while (currentSymbol != SYMBOL_END) {
		if (currentSymbol == SYMBOL_PROC) {
            getSymbol();
			functionDeclaration();
        } else {
            mark("only function declarations allowed here");
            exit(-1);
        }
    }
}